

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdcDec.c
# Opt level: O1

Bdc_Type_t Bdc_DecomposeStep(Bdc_Man_t *p,Bdc_Isf_t *pIsf,Bdc_Isf_t *pIsfL,Bdc_Isf_t *pIsfR)

{
  Bdc_Isf_t *pBVar1;
  Bdc_Isf_t *pIsfR_00;
  Bdc_Isf_t *pBVar2;
  uint *puVar3;
  uint *puVar4;
  uint *puVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  Bdc_Type_t BVar11;
  Bdc_Fun_t *pBVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  Bdc_Isf_t T;
  
  pBVar1 = p->pIsfOL;
  pBVar1->uSupp = 0;
  pBVar1->uUniq = 0;
  pIsfR_00 = p->pIsfOR;
  pIsfR_00->uSupp = 0;
  pIsfR_00->uUniq = 0;
  pBVar2 = p->pIsfAL;
  pBVar2->uSupp = 0;
  pBVar2->uUniq = 0;
  pBVar2 = p->pIsfAR;
  pBVar2->uSupp = 0;
  pBVar2->uUniq = 0;
  iVar9 = Bdc_DecomposeOr(p,pIsf,pBVar1,pIsfR_00);
  puVar3 = pIsf->puOn;
  pIsf->puOn = pIsf->puOff;
  pIsf->puOff = puVar3;
  iVar10 = Bdc_DecomposeOr(p,pIsf,p->pIsfAL,p->pIsfAR);
  puVar3 = pIsf->puOn;
  pIsf->puOn = pIsf->puOff;
  pIsf->puOff = puVar3;
  pBVar1 = p->pIsfAL;
  puVar3 = pBVar1->puOn;
  pBVar1->puOn = pBVar1->puOff;
  pBVar1->puOff = puVar3;
  pBVar1 = p->pIsfAR;
  puVar3 = pBVar1->puOn;
  pBVar1->puOn = pBVar1->puOff;
  pBVar1->puOff = puVar3;
  if (iVar9 == 0 && iVar10 == 0) {
    pBVar1 = p->pIsfOL;
    puVar3 = pIsfL->puOff;
    uVar7 = pIsfL->uSupp;
    uVar8 = pIsfL->uUniq;
    puVar4 = pIsfL->puOn;
    pIsfL->puOff = pBVar1->puOff;
    uVar6 = pBVar1->uUniq;
    puVar5 = pBVar1->puOn;
    pIsfL->uSupp = pBVar1->uSupp;
    pIsfL->uUniq = uVar6;
    pIsfL->puOn = puVar5;
    pBVar1->puOff = puVar3;
    pBVar1->uSupp = uVar7;
    pBVar1->uUniq = uVar8;
    pBVar1->puOn = puVar4;
    pBVar1 = p->pIsfOR;
    puVar3 = pIsfR->puOff;
    uVar7 = pIsfR->uSupp;
    uVar8 = pIsfR->uUniq;
    puVar4 = pIsfR->puOn;
    pIsfR->puOff = pBVar1->puOff;
    uVar6 = pBVar1->uUniq;
    puVar5 = pBVar1->puOn;
    pIsfR->uSupp = pBVar1->uSupp;
    pIsfR->uUniq = uVar6;
    pIsfR->puOn = puVar5;
    pBVar1->puOff = puVar3;
    pBVar1->uSupp = uVar7;
    pBVar1->uUniq = uVar8;
    pBVar1->puOn = puVar4;
    return BDC_TYPE_MUX;
  }
  if (iVar9 == 0 && iVar10 == 0) {
    __assert_fail("WeightOr || WeightAnd",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bool/bdc/bdcDec.c"
                  ,0x1d7,
                  "Bdc_Type_t Bdc_DecomposeStep(Bdc_Man_t *, Bdc_Isf_t *, Bdc_Isf_t *, Bdc_Isf_t *)"
                 );
  }
  bVar16 = false;
  bVar14 = false;
  bVar15 = false;
  bVar13 = false;
  if (iVar9 != 0) {
    bVar15 = false;
    if (p->pIsfOL->uUniq != 0) {
      Bdc_SuppMinimize(p,p->pIsfOL);
      pBVar12 = Bdc_TableLookup(p,p->pIsfOL);
      bVar14 = pBVar12 != (Bdc_Fun_t *)0x0;
    }
    bVar13 = bVar14;
    if (p->pIsfOR->uUniq != 0) {
      Bdc_SuppMinimize(p,p->pIsfOR);
      pBVar12 = Bdc_TableLookup(p,p->pIsfOR);
      bVar15 = pBVar12 != (Bdc_Fun_t *)0x0;
    }
  }
  bVar14 = false;
  if (iVar10 != 0) {
    bVar14 = false;
    bVar16 = false;
    if (p->pIsfAL->uUniq != 0) {
      Bdc_SuppMinimize(p,p->pIsfAL);
      pBVar12 = Bdc_TableLookup(p,p->pIsfAL);
      bVar16 = pBVar12 != (Bdc_Fun_t *)0x0;
    }
    if (p->pIsfAR->uUniq != 0) {
      Bdc_SuppMinimize(p,p->pIsfAR);
      pBVar12 = Bdc_TableLookup(p,p->pIsfAR);
      bVar14 = pBVar12 != (Bdc_Fun_t *)0x0;
    }
  }
  if ((byte)(bVar16 + bVar14) < (byte)(bVar15 + bVar13)) {
    p->numReuse = p->numReuse + 1;
LAB_005c2866:
    p->numOrs = p->numOrs + 1;
    pBVar1 = p->pIsfOL;
    puVar3 = pIsfL->puOff;
    uVar7 = pIsfL->uSupp;
    uVar8 = pIsfL->uUniq;
    puVar4 = pIsfL->puOn;
    pIsfL->puOff = pBVar1->puOff;
    uVar6 = pBVar1->uUniq;
    puVar5 = pBVar1->puOn;
    pIsfL->uSupp = pBVar1->uSupp;
    pIsfL->uUniq = uVar6;
    pIsfL->puOn = puVar5;
    pBVar1->puOff = puVar3;
    pBVar1->uSupp = uVar7;
    pBVar1->uUniq = uVar8;
    pBVar1->puOn = puVar4;
    pBVar1 = p->pIsfOR;
    puVar3 = pIsfR->puOff;
    uVar7 = pIsfR->uSupp;
    uVar8 = pIsfR->uUniq;
    puVar4 = pIsfR->puOn;
    pIsfR->puOff = pBVar1->puOff;
    uVar6 = pBVar1->uUniq;
    puVar5 = pBVar1->puOn;
    pIsfR->uSupp = pBVar1->uSupp;
    pIsfR->uUniq = uVar6;
    pIsfR->puOn = puVar5;
    pBVar1->puOff = puVar3;
    pBVar1->uSupp = uVar7;
    pBVar1->uUniq = uVar8;
    pBVar1->puOn = puVar4;
    BVar11 = BDC_TYPE_OR;
  }
  else {
    if ((byte)(bVar15 + bVar13) < (byte)(bVar16 + bVar14)) {
      p->numReuse = p->numReuse + 1;
    }
    else {
      if (iVar10 < iVar9) {
        if (iVar9 < 1000) {
          p->numWeaks = p->numWeaks + 1;
        }
        goto LAB_005c2866;
      }
      if (iVar10 < 1000) {
        p->numWeaks = p->numWeaks + 1;
      }
    }
    p->numAnds = p->numAnds + 1;
    pBVar1 = p->pIsfAL;
    puVar3 = pIsfL->puOff;
    uVar7 = pIsfL->uSupp;
    uVar8 = pIsfL->uUniq;
    puVar4 = pIsfL->puOn;
    pIsfL->puOff = pBVar1->puOff;
    uVar6 = pBVar1->uUniq;
    puVar5 = pBVar1->puOn;
    pIsfL->uSupp = pBVar1->uSupp;
    pIsfL->uUniq = uVar6;
    pIsfL->puOn = puVar5;
    pBVar1->puOff = puVar3;
    pBVar1->uSupp = uVar7;
    pBVar1->uUniq = uVar8;
    pBVar1->puOn = puVar4;
    pBVar1 = p->pIsfAR;
    puVar3 = pIsfR->puOff;
    uVar7 = pIsfR->uSupp;
    uVar8 = pIsfR->uUniq;
    puVar4 = pIsfR->puOn;
    pIsfR->puOff = pBVar1->puOff;
    uVar6 = pBVar1->uUniq;
    puVar5 = pBVar1->puOn;
    pIsfR->uSupp = pBVar1->uSupp;
    pIsfR->uUniq = uVar6;
    pIsfR->puOn = puVar5;
    pBVar1->puOff = puVar3;
    pBVar1->uSupp = uVar7;
    pBVar1->uUniq = uVar8;
    pBVar1->puOn = puVar4;
    BVar11 = BDC_TYPE_AND;
  }
  return BVar11;
}

Assistant:

Bdc_Type_t Bdc_DecomposeStep( Bdc_Man_t * p, Bdc_Isf_t * pIsf, Bdc_Isf_t * pIsfL, Bdc_Isf_t * pIsfR )
{
    int WeightOr, WeightAnd, WeightOrL, WeightOrR, WeightAndL, WeightAndR;

    Bdc_IsfClean( p->pIsfOL );
    Bdc_IsfClean( p->pIsfOR );
    Bdc_IsfClean( p->pIsfAL );
    Bdc_IsfClean( p->pIsfAR );

    // perform OR decomposition
    WeightOr = Bdc_DecomposeOr( p, pIsf, p->pIsfOL, p->pIsfOR );

    // perform AND decomposition
    Bdc_IsfNot( pIsf );
    WeightAnd = Bdc_DecomposeOr( p, pIsf, p->pIsfAL, p->pIsfAR );
    Bdc_IsfNot( pIsf );
    Bdc_IsfNot( p->pIsfAL );
    Bdc_IsfNot( p->pIsfAR );

    // check the case when decomposition does not exist
    if ( WeightOr == 0 && WeightAnd == 0 )
    {
        Bdc_IsfCopy( pIsfL, p->pIsfOL );
        Bdc_IsfCopy( pIsfR, p->pIsfOR );
        return BDC_TYPE_MUX;
    }
    // check the hash table
    assert( WeightOr || WeightAnd );
    WeightOrL = WeightOrR = 0;
    if ( WeightOr )
    {
        if ( p->pIsfOL->uUniq )
        {
            Bdc_SuppMinimize( p, p->pIsfOL );
            WeightOrL = (Bdc_TableLookup(p, p->pIsfOL) != NULL);
        }
        if ( p->pIsfOR->uUniq )
        {
            Bdc_SuppMinimize( p, p->pIsfOR );
            WeightOrR = (Bdc_TableLookup(p, p->pIsfOR) != NULL);
        }
    }
    WeightAndL = WeightAndR = 0;
    if ( WeightAnd )
    {
        if ( p->pIsfAL->uUniq )
        {
            Bdc_SuppMinimize( p, p->pIsfAL );
            WeightAndL = (Bdc_TableLookup(p, p->pIsfAL) != NULL);
        }
        if ( p->pIsfAR->uUniq )
        {
            Bdc_SuppMinimize( p, p->pIsfAR );
            WeightAndR = (Bdc_TableLookup(p, p->pIsfAR) != NULL);
        }
    }

    // check if there is any reuse for the components
    if ( WeightOrL + WeightOrR > WeightAndL + WeightAndR )
    {
        p->numReuse++;
        p->numOrs++;
        Bdc_IsfCopy( pIsfL, p->pIsfOL );
        Bdc_IsfCopy( pIsfR, p->pIsfOR );
        return BDC_TYPE_OR;
    }
    if ( WeightOrL + WeightOrR < WeightAndL + WeightAndR )
    {
        p->numReuse++;
        p->numAnds++;
        Bdc_IsfCopy( pIsfL, p->pIsfAL );
        Bdc_IsfCopy( pIsfR, p->pIsfAR );
        return BDC_TYPE_AND; 
    }

    // compare the two-component costs
    if ( WeightOr > WeightAnd )
    {
        if ( WeightOr < BDC_SCALE )
            p->numWeaks++;
        p->numOrs++;
        Bdc_IsfCopy( pIsfL, p->pIsfOL );
        Bdc_IsfCopy( pIsfR, p->pIsfOR );
        return BDC_TYPE_OR;
    }
    if ( WeightAnd < BDC_SCALE )
        p->numWeaks++;
    p->numAnds++;
    Bdc_IsfCopy( pIsfL, p->pIsfAL );
    Bdc_IsfCopy( pIsfR, p->pIsfAR );
    return BDC_TYPE_AND;
}